

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Namespace.h
# Opt level: O3

Namespace __thiscall luabridge::Namespace::endNamespace(Namespace *this)

{
  int iVar1;
  logic_error *this_00;
  undefined8 extraout_RDX;
  undefined8 *in_RSI;
  Namespace NVar2;
  
  iVar1 = *(int *)(in_RSI + 1);
  if (iVar1 == 1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"endNamespace () called on global namespace");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (1 < iVar1) {
    *(int *)(in_RSI + 1) = iVar1 + -1;
    lua_settop((lua_State *)*in_RSI,-2);
    (this->super_Registrar).L = (lua_State *)*in_RSI;
    (this->super_Registrar).m_stackSize = *(int *)(in_RSI + 1);
    *(undefined4 *)(in_RSI + 1) = 0;
    NVar2.super_Registrar._8_8_ = extraout_RDX;
    NVar2.super_Registrar.L = (lua_State *)this;
    return (Namespace)NVar2.super_Registrar;
  }
  __assert_fail("m_stackSize > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/Namespace.h"
                ,0x456,"Namespace luabridge::Namespace::endNamespace()");
}

Assistant:

Namespace endNamespace()
    {
        if (m_stackSize == 1)
        {
            throw std::logic_error("endNamespace () called on global namespace");
        }

        assert(m_stackSize > 1);
        --m_stackSize;
        lua_pop(L, 1);
        return Namespace(*this);
    }